

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O3

wchar_t calc_unlocking_chance(player *p,wchar_t lock_power,_Bool lock_unseen)

{
  int16_t *piVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  undefined7 in_register_00000011;
  
  iVar3 = (p->state).skills[0];
  piVar1 = p->timed;
  if (((int)CONCAT71(in_register_00000011,lock_unseen) != 0) || (piVar1[2] != 0)) {
    iVar3 = iVar3 / 10;
  }
  if ((piVar1[4] != 0) || (piVar1[6] != 0)) {
    iVar3 = iVar3 / 10;
  }
  wVar4 = iVar3 + lock_power * -4;
  wVar2 = L'\x02';
  if (L'\x02' < wVar4) {
    wVar2 = wVar4;
  }
  return wVar2;
}

Assistant:

int calc_unlocking_chance(const struct player *p, int lock_power,
		bool lock_unseen)
{
	int skill = p->state.skills[SKILL_DISARM_PHYS];

	if (lock_unseen || p->timed[TMD_BLIND]) {
		skill /= 10;
	}
	if (p->timed[TMD_CONFUSED] || p->timed[TMD_IMAGE]) {
		skill /= 10;
	}

	/* Always allow some chance of unlocking. */
	return MAX(2, skill - 4 * lock_power);
}